

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

void __thiscall gmath::OrthoCamera::OrthoCamera(OrthoCamera *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  long lVar5;
  
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR__Camera_001637d0;
  (this->super_Camera).name._M_dataplus._M_p = (pointer)&(this->super_Camera).name.field_2;
  (this->super_Camera).name._M_string_length = 0;
  (this->super_Camera).name.field_2._M_local_buf[0] = '\0';
  (this->super_Camera).R.v[0][0] = 0.0;
  (this->super_Camera).R.v[0][1] = 0.0;
  (this->super_Camera).R.v[0][2] = 0.0;
  (this->super_Camera).R.v[1][0] = 0.0;
  (this->super_Camera).R.v[1][1] = 0.0;
  (this->super_Camera).R.v[1][2] = 0.0;
  (this->super_Camera).R.v[2][0] = 0.0;
  (this->super_Camera).R.v[2][1] = 0.0;
  (this->super_Camera).R.v[2][2] = 0.0;
  auVar2 = _DAT_001534a0;
  lVar3 = 0x58;
  auVar4 = _DAT_00153490;
  do {
    if (SUB164(auVar4 ^ auVar2,4) == -0x80000000 && SUB164(auVar4 ^ auVar2,0) < -0x7ffffffd) {
      *(undefined8 *)((long)((this->super_Camera).R.v + -4) + 8 + lVar3) = 0x3ff0000000000000;
      *(undefined8 *)((long)((this->super_Camera).R.v + -3) + 0x10 + lVar3) = 0x3ff0000000000000;
    }
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 2;
    auVar4._8_8_ = lVar5 + 2;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0xd8);
  pvVar1 = &(this->super_Camera).match;
  (pvVar1->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Camera).match.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Camera).width = 0;
  (this->super_Camera).height = 0;
  (this->super_Camera).T.v[0] = 0.0;
  (this->super_Camera).T.v[1] = 0.0;
  *(undefined1 (*) [16])((this->super_Camera).T.v + 2) = (undefined1  [16])0x0;
  (this->super_Camera).zmax = 1.79769313486232e+308;
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR__Camera_00163890;
  this->res = 1.0;
  this->dres = 1.0;
  return;
}

Assistant:

virtual ~Camera() {}